

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::OneHotEncoder::clear_CategoryType(OneHotEncoder *this)

{
  CategoryTypeCase CVar1;
  OneHotEncoder *this_local;
  
  CVar1 = CategoryType_case(this);
  if (CVar1 != CATEGORYTYPE_NOT_SET) {
    if (CVar1 == kStringCategories) {
      if ((this->CategoryType_).stringcategories_ != (StringVector *)0x0) {
        (*(((this->CategoryType_).stringcategories_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if ((CVar1 == kInt64Categories) &&
            ((this->CategoryType_).stringcategories_ != (StringVector *)0x0)) {
      (*(((this->CategoryType_).stringcategories_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void OneHotEncoder::clear_CategoryType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.OneHotEncoder)
  switch (CategoryType_case()) {
    case kStringCategories: {
      delete CategoryType_.stringcategories_;
      break;
    }
    case kInt64Categories: {
      delete CategoryType_.int64categories_;
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CATEGORYTYPE_NOT_SET;
}